

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateTranslationNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time,
          bool inverse)

{
  uint uVar1;
  aiNodeAnim *na;
  long lVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  LayerMap *pLVar5;
  ulong uVar6;
  
  pLVar5 = (LayerMap *)curves;
  na = (aiNodeAnim *)operator_new(0x438);
  (na->mNodeName).length = 0;
  (na->mNodeName).data[0] = '\0';
  memset((na->mNodeName).data + 1,0x1b,0x3ff);
  na->mRotationKeys = (aiQuatKey *)0x0;
  na->mNumScalingKeys = 0;
  *(undefined8 *)&na->mNumPositionKeys = 0;
  *(undefined8 *)((long)&na->mPositionKeys + 4) = 0;
  na->mScalingKeys = (aiVectorKey *)0x0;
  na->mPreState = aiAnimBehaviour_DEFAULT;
  na->mPostState = aiAnimBehaviour_DEFAULT;
  uVar6 = name->_M_string_length;
  if (uVar6 < 0x400) {
    (na->mNodeName).length = (ai_uint32)uVar6;
    memcpy((na->mNodeName).data,(name->_M_dataplus)._M_p,uVar6);
    (na->mNodeName).data[uVar6] = '\0';
  }
  ConvertTranslationKeys(this,na,curves,pLVar5,start,stop,max_time,min_time);
  if ((inverse) && (na->mNumPositionKeys != 0)) {
    lVar2 = 0x10;
    uVar6 = 0;
    do {
      paVar3 = na->mPositionKeys;
      uVar1 = *(uint *)((long)&paVar3->mTime + lVar2);
      *(uint *)((long)paVar3 + lVar2 + -8) = *(uint *)((long)paVar3 + lVar2 + -8) ^ 0x80000000;
      *(uint *)((long)paVar3 + lVar2 + -4) = *(uint *)((long)paVar3 + lVar2 + -4) ^ 0x80000000;
      *(uint *)((long)&paVar3->mTime + lVar2) = uVar1 ^ 0x80000000;
      uVar6 = uVar6 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar6 < na->mNumPositionKeys);
  }
  paVar3 = (aiVectorKey *)operator_new__(0x18);
  paVar3->mTime = 0.0;
  (paVar3->mValue).x = 0.0;
  (paVar3->mValue).y = 0.0;
  (paVar3->mValue).z = 0.0;
  na->mScalingKeys = paVar3;
  na->mNumScalingKeys = 1;
  paVar3->mTime = 0.0;
  paVar3 = na->mScalingKeys;
  (paVar3->mValue).x = 1.0;
  (paVar3->mValue).y = 1.0;
  (paVar3->mValue).z = 1.0;
  paVar4 = (aiQuatKey *)operator_new__(0x18);
  paVar4->mTime = 0.0;
  (paVar4->mValue).w = 1.0;
  (paVar4->mValue).x = 0.0;
  (paVar4->mValue).y = 0.0;
  (paVar4->mValue).z = 0.0;
  na->mRotationKeys = paVar4;
  na->mNumRotationKeys = 1;
  paVar4->mTime = 0.0;
  paVar4 = na->mRotationKeys;
  (paVar4->mValue).w = 1.0;
  (paVar4->mValue).x = 0.0;
  (paVar4->mValue).y = 0.0;
  (paVar4->mValue).z = 0.0;
  return na;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateTranslationNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool inverse) {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertTranslationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            if (inverse) {
                for (unsigned int i = 0; i < na->mNumPositionKeys; ++i) {
                    na->mPositionKeys[i].mValue *= -1.0f;
                }
            }

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            return na.release();
        }